

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorPool::Tables::AddSymbol
          (Tables *this,string_view full_name,Symbol symbol)

{
  pointer *ppSVar1;
  char *pcVar2;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
  *prVar3;
  CommonFields *pCVar4;
  long lVar5;
  ctrl_t *ctrl;
  iterator __position;
  uint uVar6;
  ushort uVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  char cVar38;
  char cVar39;
  undefined1 uVar40;
  ushort uVar42;
  int iVar43;
  Symbol *key;
  bool bVar41;
  uint uVar44;
  uint64_t uVar45;
  anon_union_8_1_a8a14541_for_iterator_2 aVar46;
  slot_type *this_00;
  size_t sVar47;
  Symbol *b;
  Symbol *b_00;
  size_t cap_1;
  size_t __n;
  PolicyFunctions *in_R9;
  ulong uVar48;
  Symbol *key_1;
  CommonFields *common;
  size_type __rlen;
  Symbol *key_2;
  ulong uVar49;
  CommonFields *common_00;
  undefined4 uVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  __m128i match;
  undefined1 auVar53 [16];
  string_view sVar54;
  iterator iVar55;
  FindInfo target;
  Symbol local_b0;
  CommonFields *local_a8;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
  *local_a0;
  HeapOrSoo *local_98;
  Tables *local_90;
  string_view local_88;
  size_t local_78;
  char *local_70;
  char local_68;
  char cStack_67;
  char cStack_66;
  char cStack_65;
  char cStack_64;
  char cStack_63;
  char cStack_62;
  char cStack_61;
  char cStack_60;
  char cStack_5f;
  char cStack_5e;
  char cStack_5d;
  char cStack_5c;
  char cStack_5b;
  char cStack_5a;
  char cStack_59;
  undefined1 local_58 [16];
  
  __n = full_name._M_len;
  local_b0.ptr_ = symbol.ptr_;
  local_78 = __n;
  local_70 = full_name._M_str;
  local_88 = Symbol::full_name(&local_b0);
  if ((local_88._M_len == __n) &&
     ((__n == 0 || (iVar43 = bcmp(full_name._M_str,local_88._M_str,__n), iVar43 == 0)))) {
    common = (CommonFields *)&this->symbols_by_name_;
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
    ::AssertOnFind<google::protobuf::Symbol>
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                *)common,&local_b0);
    prVar3 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
              *)(this->symbols_by_name_).
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                .settings_.
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.capacity_;
    if (prVar3 == (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                   *)0x1) {
      if ((this->symbols_by_name_).
          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
          .settings_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          size_ < 2) {
        absl::lts_20250127::container_internal::CommonFields::AssertInSooMode(common);
        (this->symbols_by_name_).
        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
        .settings_.
        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
        .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_
             = 2;
        aVar46.slot_ = absl::lts_20250127::container_internal::
                       raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                       ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                                   *)common);
        iVar55.field_1.slot_ = aVar46.slot_;
        iVar55.ctrl_ = absl::lts_20250127::container_internal::kSooControl;
      }
      else {
        this_00 = absl::lts_20250127::container_internal::
                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                  ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                              *)common);
        bVar41 = (anonymous_namespace)::SymbolByFullNameEq::operator()(this_00,&local_b0,b_00);
        if (bVar41) {
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
          ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                      *)common);
          return false;
        }
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
        ::resize_impl(common,3);
        sVar54 = Symbol::full_name(&local_b0);
        uVar45 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                           (&absl::lts_20250127::hash_internal::MixingHashState::kSeed,sVar54._M_str
                            ,sVar54._M_len);
        uVar48 = (sVar54._M_len ^ uVar45) * -0x234dd359734ecb13;
        sVar47 = absl::lts_20250127::container_internal::PrepareInsertAfterSoo
                           (uVar48 >> 0x38 | (uVar48 & 0xff000000000000) >> 0x28 |
                            (uVar48 & 0xff0000000000) >> 0x18 | (uVar48 & 0xff00000000) >> 8 |
                            (uVar48 & 0xff000000) << 8 | (uVar48 & 0xff0000) << 0x18 |
                            (uVar48 & 0xff00) << 0x28 | uVar48 << 0x38,8,common);
LAB_0015465b:
        iVar55 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                 ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                                *)common,sVar47);
      }
      sVar47 = common->capacity_;
      common->capacity_ = 0xffffffffffffff9c;
      (iVar55.field_1.slot_)->ptr_ = local_b0.ptr_;
      absl::lts_20250127::container_internal::CommonFields::set_capacity(common,sVar47);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
      ::iterator::operator*((iterator *)iVar55.ctrl_);
      iVar55 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
               ::find<google::protobuf::Symbol>
                         ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                           *)common,iVar55.field_1.slot_);
      bVar41 = absl::lts_20250127::container_internal::operator==
                         ((iterator *)iVar55.ctrl_,(iterator *)iVar55.field_1.slot_);
      if (!bVar41) {
        __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xfe2,
                      "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByFullNameHash, google::protobuf::(anonymous namespace)::SymbolByFullNameEq, std::allocator<google::protobuf::Symbol>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByFullNameHash, Eq = google::protobuf::(anonymous namespace)::SymbolByFullNameEq, Alloc = std::allocator<google::protobuf::Symbol>, Args = <const google::protobuf::Symbol &>]"
                     );
      }
      __position._M_current =
           (this->symbols_after_checkpoint_).
           super__Vector_base<google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->symbols_after_checkpoint_).
          super__Vector_base<google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<google::protobuf::Symbol,std::allocator<google::protobuf::Symbol>>::
        _M_realloc_insert<google::protobuf::Symbol_const&>
                  ((vector<google::protobuf::Symbol,std::allocator<google::protobuf::Symbol>> *)
                   &this->symbols_after_checkpoint_,__position,&local_b0);
      }
      else {
        (__position._M_current)->ptr_ = local_b0.ptr_;
        ppSVar1 = &(this->symbols_after_checkpoint_).
                   super__Vector_base<google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      return true;
    }
    if (prVar3 != (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                   *)0x0) {
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
      ::prefetch_heap_block(prVar3);
      sVar54 = Symbol::full_name(&local_b0);
      uVar45 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                         (&absl::lts_20250127::hash_internal::MixingHashState::kSeed,sVar54._M_str,
                          sVar54._M_len);
      prVar3 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                *)(this->symbols_by_name_).
                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                  .settings_.
                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                  value.capacity_;
      if (((ulong)((long)&(prVar3->settings_).
                          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                          .
                          super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                          .value.capacity_ + 1U) & (ulong)prVar3) != 0) {
        __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x14c,
                      "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                     );
      }
      uVar49 = (uVar45 ^ sVar54._M_len) * -0x234dd359734ecb13;
      common_00 = (CommonFields *)
                  (uVar49 >> 0x38 | (uVar49 & 0xff000000000000) >> 0x28 |
                   (uVar49 & 0xff0000000000) >> 0x18 | (uVar49 & 0xff00000000) >> 8 |
                   (uVar49 & 0xff000000) << 8 | (uVar49 & 0xff0000) << 0x18 |
                   (uVar49 & 0xff00) << 0x28 | uVar49 << 0x38);
      pCVar4 = (CommonFields *)
               (this->symbols_by_name_).
               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
               .settings_.
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
               value.heap_or_soo_.heap.control;
      uVar48 = (ulong)common_00 >> 7 ^ (ulong)pCVar4 >> 0xc;
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
      ::control(prVar3);
      uVar40 = (undefined1)(uVar49 >> 0x38);
      auVar51 = ZEXT216(CONCAT11(uVar40,uVar40) & 0x7f7f);
      auVar51 = pshuflw(auVar51,auVar51,0);
      uVar50 = auVar51._0_4_;
      auVar51._4_4_ = uVar50;
      auVar51._0_4_ = uVar50;
      auVar51._8_4_ = uVar50;
      auVar51._12_4_ = uVar50;
      local_98 = (HeapOrSoo *)0x0;
      local_a8 = pCVar4;
      local_a0 = prVar3;
      while( true ) {
        uVar48 = uVar48 & (ulong)local_a0;
        pcVar2 = (char *)((long)&(((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                                    *)&local_a8->capacity_)->settings_).
                                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                 .
                                 super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                 .value.capacity_ + uVar48);
        auVar52[0] = -(auVar51[0] == *pcVar2);
        auVar52[1] = -(auVar51[1] == pcVar2[1]);
        auVar52[2] = -(auVar51[2] == pcVar2[2]);
        auVar52[3] = -(auVar51[3] == pcVar2[3]);
        auVar52[4] = -(auVar51[4] == pcVar2[4]);
        auVar52[5] = -(auVar51[5] == pcVar2[5]);
        auVar52[6] = -(auVar51[6] == pcVar2[6]);
        auVar52[7] = -(auVar51[7] == pcVar2[7]);
        auVar52[8] = -(auVar51[8] == pcVar2[8]);
        auVar52[9] = -(auVar51[9] == pcVar2[9]);
        auVar52[10] = -(auVar51[10] == pcVar2[10]);
        auVar52[0xb] = -(auVar51[0xb] == pcVar2[0xb]);
        auVar52[0xc] = -(auVar51[0xc] == pcVar2[0xc]);
        auVar52[0xd] = -(auVar51[0xd] == pcVar2[0xd]);
        auVar52[0xe] = -(auVar51[0xe] == pcVar2[0xe]);
        auVar52[0xf] = -(auVar51[0xf] == pcVar2[0xf]);
        uVar42 = (ushort)(SUB161(auVar52 >> 7,0) & 1) | (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar52 >> 0x77,0) & 1) << 0xe | (ushort)(auVar52[0xf] >> 7) << 0xf
        ;
        uVar44 = (uint)uVar42;
        cVar24 = *pcVar2;
        cVar25 = pcVar2[1];
        cVar26 = pcVar2[2];
        cVar27 = pcVar2[3];
        cVar28 = pcVar2[4];
        cVar29 = pcVar2[5];
        cVar30 = pcVar2[6];
        cVar31 = pcVar2[7];
        cVar32 = pcVar2[8];
        cVar33 = pcVar2[9];
        cVar34 = pcVar2[10];
        cVar35 = pcVar2[0xb];
        cVar36 = pcVar2[0xc];
        cVar37 = pcVar2[0xd];
        cVar38 = pcVar2[0xe];
        cVar39 = pcVar2[0xf];
        cVar8 = local_68;
        cVar9 = cStack_67;
        cVar10 = cStack_66;
        cVar11 = cStack_65;
        cVar12 = cStack_64;
        cVar13 = cStack_63;
        cVar14 = cStack_62;
        cVar15 = cStack_61;
        cVar16 = cStack_60;
        cVar17 = cStack_5f;
        cVar18 = cStack_5e;
        cVar19 = cStack_5d;
        cVar20 = cStack_5c;
        cVar21 = cStack_5b;
        cVar22 = cStack_5a;
        cVar23 = cStack_59;
        while (cStack_59 = cVar39, cStack_5a = cVar38, cStack_5b = cVar37, cStack_5c = cVar36,
              cStack_5d = cVar35, cStack_5e = cVar34, cStack_5f = cVar33, cStack_60 = cVar32,
              cStack_61 = cVar31, cStack_62 = cVar30, cStack_63 = cVar29, cStack_64 = cVar28,
              cStack_65 = cVar27, cStack_66 = cVar26, cStack_67 = cVar25, local_68 = cVar24,
              uVar42 != 0) {
          uVar6 = 0;
          if (uVar44 != 0) {
            for (; (uVar44 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
            }
          }
          uVar49 = uVar6 + uVar48 & (ulong)local_a0;
          lVar5 = *(long *)((long)&(this->symbols_by_name_).
                                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                                   .settings_.
                                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                   .
                                   super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                   .value.heap_or_soo_ + 8);
          local_90 = this;
          local_58 = auVar51;
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
          ::slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                        *)(this->symbols_by_name_).
                          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                          .settings_.
                          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                          .
                          super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                          .value.capacity_);
          bVar41 = (anonymous_namespace)::SymbolByFullNameEq::operator()
                             ((void *)(uVar49 * 8 + lVar5),&local_b0,b);
          if (bVar41) {
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
            ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                           *)common,uVar49);
            return false;
          }
          uVar42 = (ushort)(uVar44 - 1) & (ushort)uVar44;
          uVar44 = CONCAT22((short)(uVar44 - 1 >> 0x10),uVar42);
          this = local_90;
          auVar51 = local_58;
          cVar24 = local_68;
          cVar25 = cStack_67;
          cVar26 = cStack_66;
          cVar27 = cStack_65;
          cVar28 = cStack_64;
          cVar29 = cStack_63;
          cVar30 = cStack_62;
          cVar31 = cStack_61;
          cVar32 = cStack_60;
          cVar33 = cStack_5f;
          cVar34 = cStack_5e;
          cVar35 = cStack_5d;
          cVar36 = cStack_5c;
          cVar37 = cStack_5b;
          cVar38 = cStack_5a;
          cVar39 = cStack_59;
          cVar8 = local_68;
          cVar9 = cStack_67;
          cVar10 = cStack_66;
          cVar11 = cStack_65;
          cVar12 = cStack_64;
          cVar13 = cStack_63;
          cVar14 = cStack_62;
          cVar15 = cStack_61;
          cVar16 = cStack_60;
          cVar17 = cStack_5f;
          cVar18 = cStack_5e;
          cVar19 = cStack_5d;
          cVar20 = cStack_5c;
          cVar21 = cStack_5b;
          cVar22 = cStack_5a;
          cVar23 = cStack_59;
        }
        auVar53[0] = -(local_68 == -0x80);
        auVar53[1] = -(cStack_67 == -0x80);
        auVar53[2] = -(cStack_66 == -0x80);
        auVar53[3] = -(cStack_65 == -0x80);
        auVar53[4] = -(cStack_64 == -0x80);
        auVar53[5] = -(cStack_63 == -0x80);
        auVar53[6] = -(cStack_62 == -0x80);
        auVar53[7] = -(cStack_61 == -0x80);
        auVar53[8] = -(cStack_60 == -0x80);
        auVar53[9] = -(cStack_5f == -0x80);
        auVar53[10] = -(cStack_5e == -0x80);
        auVar53[0xb] = -(cStack_5d == -0x80);
        auVar53[0xc] = -(cStack_5c == -0x80);
        auVar53[0xd] = -(cStack_5b == -0x80);
        auVar53[0xe] = -(cStack_5a == -0x80);
        auVar53[0xf] = -(cStack_59 == -0x80);
        uVar42 = (ushort)(SUB161(auVar53 >> 7,0) & 1) | (ushort)(SUB161(auVar53 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar53 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar53 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar53 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar53 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar53 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar53 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar53 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar53 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar53 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar53 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar53 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar53 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar53 >> 0x77,0) & 1) << 0xe | (ushort)(auVar53[0xf] >> 7) << 0xf
        ;
        prVar3 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                  *)(((SymbolsByNameSet *)common)->
                    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                    ).settings_.
                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                    .value.capacity_;
        local_68 = cVar8;
        cStack_67 = cVar9;
        cStack_66 = cVar10;
        cStack_65 = cVar11;
        cStack_64 = cVar12;
        cStack_63 = cVar13;
        cStack_62 = cVar14;
        cStack_61 = cVar15;
        cStack_60 = cVar16;
        cStack_5f = cVar17;
        cStack_5e = cVar18;
        cStack_5d = cVar19;
        cStack_5c = cVar20;
        cStack_5b = cVar21;
        cStack_5a = cVar22;
        cStack_59 = cVar23;
        if (uVar42 != 0) break;
        if (prVar3 == (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                       *)0x0) goto LAB_0015470e;
        uVar48 = (long)local_98 + uVar48 + 0x10;
        local_98 = local_98 + 1;
        if (prVar3 < local_98) {
          __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xf7d,
                        "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByFullNameHash, google::protobuf::(anonymous namespace)::SymbolByFullNameEq, std::allocator<google::protobuf::Symbol>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByFullNameHash, Eq = google::protobuf::(anonymous namespace)::SymbolByFullNameEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::Symbol]"
                       );
        }
      }
      local_a8 = common;
      if (prVar3 != (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                     *)0x0) {
        ctrl = (this->symbols_by_name_).
               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
               .settings_.
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
               value.heap_or_soo_.heap.control;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
        ::control(prVar3);
        bVar41 = absl::lts_20250127::container_internal::ShouldInsertBackwardsForDebug
                           ((size_t)prVar3,(size_t)common_00,ctrl);
        common = local_a8;
        if (bVar41) {
          uVar7 = 0xf;
          if (uVar42 != 0) {
            for (; uVar42 >> uVar7 == 0; uVar7 = uVar7 - 1) {
            }
          }
          uVar44 = (ushort)((uVar7 ^ 0xfff0) + 0x11) - 1;
        }
        else {
          uVar44 = 0;
          if (uVar42 != 0) {
            for (; (uVar42 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
            }
          }
        }
        target.probe_length =
             (size_t)absl::lts_20250127::container_internal::
                     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,std::allocator<google::protobuf::Symbol>>
                     ::GetPolicyFunctions()::value;
        target.offset = (size_t)local_98;
        sVar47 = absl::lts_20250127::container_internal::PrepareInsertNonSoo
                           ((container_internal *)local_a8,common_00,
                            uVar44 + uVar48 & (ulong)local_a0,target,in_R9);
        goto LAB_0015465b;
      }
    }
  }
  else {
    AddSymbol();
  }
LAB_0015470e:
  __assert_fail("cap >= kDefaultCapacity",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xb75,
                "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByFullNameHash, google::protobuf::(anonymous namespace)::SymbolByFullNameEq, std::allocator<google::protobuf::Symbol>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByFullNameHash, Eq = google::protobuf::(anonymous namespace)::SymbolByFullNameEq, Alloc = std::allocator<google::protobuf::Symbol>]"
               );
}

Assistant:

bool DescriptorPool::Tables::AddSymbol(absl::string_view full_name,
                                       Symbol symbol) {
  ABSL_DCHECK_EQ(full_name, symbol.full_name());
  if (symbols_by_name_.insert(symbol).second) {
    symbols_after_checkpoint_.push_back(symbol);
    return true;
  } else {
    return false;
  }
}